

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

void __thiscall Compiler::compile(Compiler *this,Node *node)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  pointer pcVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  pointer pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> exp;
  ofstream fout;
  long *local_250;
  long local_248;
  long local_240 [2];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  treeTraversal(this,node,&this->TEXT);
  std::ofstream::ofstream((ostream *)&local_230,(string *)&this->ASSEMBLY_FILE_NAME,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,(this->SECTION_DATA)._M_dataplus._M_p,
             (this->SECTION_DATA)._M_string_length);
  p_Var5 = (this->VARIABLES)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->VARIABLES)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": resd 1",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,(this->SECTION_TEXT)._M_dataplus._M_p,
             (this->SECTION_TEXT)._M_string_length);
  p_Var5 = (this->FUNCTIONS)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->FUNCTIONS)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"global ",7);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,(this->TEXT)._M_dataplus._M_p,(this->TEXT)._M_string_length);
  pbVar6 = (this->expressions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->expressions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar6 != pbVar2) {
    do {
      pcVar3 = (pbVar6->_M_dataplus)._M_p;
      local_250 = local_240;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,pcVar3,pcVar3 + pbVar6->_M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,(char *)local_250,local_248);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if (local_250 != local_240) {
        operator_delete(local_250,local_240[0] + 1);
      }
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar2);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Compiler::compile(Node &node) {
    treeTraversal(node, TEXT);
    ofstream fout(ASSEMBLY_FILE_NAME);
    fout << SECTION_DATA;
    for (const auto &var : VARIABLES) {
        fout << var.first << ": resd 1" << endl;
    }
    fout << "\n";
    fout << SECTION_TEXT;
    for (auto &func : FUNCTIONS) {
        fout << "global " << func << endl;
    }
    fout << "\n";
    fout << TEXT;
    for (auto exp : expressions) {
        fout << exp << endl;
    }
    fout.close();
//    print();
}